

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void gray_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  JSAMPLE JVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  JSAMPARRAY ppJVar4;
  uint uVar5;
  uint local_44;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  JSAMPARRAY ppJStack_28;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  uVar2 = cinfo->output_width;
  inptr._4_4_ = num_rows;
  ppJStack_28 = output_buf;
  output_buf_local._4_4_ = input_row;
  while (inptr._4_4_ = inptr._4_4_ + -1, -1 < inptr._4_4_) {
    uVar5 = output_buf_local._4_4_ + 1;
    pJVar3 = (*input_buf)[output_buf_local._4_4_];
    ppJVar4 = ppJStack_28 + 1;
    _num_cols = *ppJStack_28;
    for (local_44 = 0; ppJStack_28 = ppJVar4, output_buf_local._4_4_ = uVar5, local_44 < uVar2;
        local_44 = local_44 + 1) {
      JVar1 = pJVar3[local_44];
      _num_cols[2] = JVar1;
      _num_cols[1] = JVar1;
      *_num_cols = JVar1;
      _num_cols = _num_cols + 3;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb_convert (j_decompress_ptr cinfo,
		  JSAMPIMAGE input_buf, JDIMENSION input_row,
		  JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr = input_buf[0][input_row++];
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      /* We can dispense with GETJSAMPLE() here */
      outptr[RGB_RED] = outptr[RGB_GREEN] = outptr[RGB_BLUE] = inptr[col];
      outptr += RGB_PIXELSIZE;
    }
  }
}